

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

bool SetUserDefinedDevice(char *id,CDevice **dev,CDevice *parent,aint ramtop)

{
  CDeviceDef *this;
  bool bVar1;
  reference ppCVar2;
  CDevice *this_00;
  char *name;
  CDeviceDef *def;
  char **local_50;
  CDeviceDef **local_48;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
  local_40;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
  local_38;
  __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_> findIt
  ;
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  char *id_local;
  
  findIt._M_current._4_4_ = ramtop;
  dev_local = (CDevice **)id;
  local_40._M_current =
       (CDeviceDef **)std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::begin(&DefDevices);
  local_48 = (CDeviceDef **)
             std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::end(&DefDevices);
  local_50 = (char **)&dev_local;
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<CDeviceDef**,std::vector<CDeviceDef*,std::allocator<CDeviceDef*>>>,SetUserDefinedDevice(char_const*,CDevice**,CDevice*,int)::__0>
                       (local_40,(__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                                  )local_48,(anon_class_8_1_3fcf65d9_for__M_pred)local_50);
  def = (CDeviceDef *)std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>::end(&DefDevices);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
                      *)&def,&local_38);
  if (bVar1) {
    id_local._7_1_ = false;
  }
  else {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<CDeviceDef_**,_std::vector<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>_>
              ::operator*(&local_38);
    this = *ppCVar2;
    if (findIt._M_current._4_4_ != 0) {
      WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
    }
    this_00 = (CDevice *)operator_new(0x2838);
    name = CDeviceDef::getID(this);
    CDevice::CDevice(this_00,name,parent);
    *dev = this_00;
    initRegularSlotDevice(*dev,this->SlotSize,this->SlotsCount,this->PagesCount,this->initialPages);
    id_local._7_1_ = true;
  }
  return id_local._7_1_;
}

Assistant:

static bool SetUserDefinedDevice(const char* id, CDevice** dev, CDevice* parent, aint ramtop) {
	auto findIt = std::find_if(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (DefDevices.end() == findIt) return false;	// not found
	const CDeviceDef & def = **findIt;
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice(def.getID(), parent);
	initRegularSlotDevice(*dev, def.SlotSize, def.SlotsCount, def.PagesCount, def.initialPages);
	return true;
}